

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
               (tuple<testing::Matcher<cv::Mat>_> *matchers,tuple<cv::Mat> *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<Mat>_>_> *p_Var2;
  __tuple_element_t<0UL,_tuple<Mat>_> *p_Var3;
  ostream *poVar4;
  MatcherBase<cv::Mat> *this;
  string local_2c0;
  Mat local_2a0 [96];
  undefined1 local_240 [8];
  StringMatchResultListener listener;
  Mat local_98 [8];
  Value value;
  undefined1 local_38 [8];
  type matcher;
  ostream *os_local;
  tuple<cv::Mat> *values_local;
  tuple<testing::Matcher<cv::Mat>_> *matchers_local;
  
  matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_ = (linked_ptr_internal *)os;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<cv::Mat>>(matchers);
  Matcher<cv::Mat>::Matcher((Matcher<cv::Mat> *)local_38,p_Var2);
  p_Var3 = std::get<0ul,cv::Mat>(values);
  cv::Mat::Mat(local_98,p_Var3);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_240);
  cv::Mat::Mat(local_2a0,local_98);
  bVar1 = MatcherBase<cv::Mat>::MatchAndExplain
                    ((MatcherBase<cv::Mat> *)local_38,local_2a0,(MatchResultListener *)local_240);
  cv::Mat::~Mat(local_2a0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_,
                             "  Expected arg #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,": ");
    this = &std::get<0ul,testing::Matcher<cv::Mat>>(matchers)->super_MatcherBase<cv::Mat>;
    MatcherBase<cv::Mat>::DescribeTo
              (this,(ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_);
    std::operator<<((ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_,
                    "\n           Actual: ");
    UniversalPrint<cv::Mat>
              (local_98,(ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_);
    StringMatchResultListener::str_abi_cxx11_(&local_2c0,(StringMatchResultListener *)local_240);
    PrintIfNotEmpty(&local_2c0,(ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::operator<<((ostream *)matcher.super_MatcherBase<cv::Mat>.impl_.link_.next_,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_240);
  cv::Mat::~Mat(local_98);
  Matcher<cv::Mat>::~Matcher((Matcher<cv::Mat> *)local_38);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }